

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardSubsumptionDemodulation.cpp
# Opt level: O0

bool __thiscall
Inferences::BackwardSubsumptionDemodulation::simplifyCandidate
          (BackwardSubsumptionDemodulation *this,Clause *sideCl,Clause *mainCl,
          vector<Inferences::BwSimplificationRecord,_std::allocator<Inferences::BwSimplificationRecord>_>
          *simplifications)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  reference ppLVar5;
  Clause *in_RDX;
  Clause *in_RSI;
  long *in_RDI;
  Clause *replacement;
  uint numMatches;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_BackwardSubsumptionDemodulation_cpp:309:5)>
  on_scope_exit_guard_on_line_313;
  Literal *instLit;
  uint ii;
  Literal *baseLit;
  uint bi;
  uint baseLitsWithoutAlternatives;
  Clause **in_stack_00000288;
  MLMatcherSD *in_stack_00000290;
  Clause *in_stack_00000298;
  Clause *in_stack_000002a0;
  BackwardSubsumptionDemodulation *in_stack_000002a8;
  undefined2 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3a;
  undefined1 in_stack_ffffffffffffff3b;
  undefined4 in_stack_ffffffffffffff3c;
  Options *in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  Options *in_stack_ffffffffffffff50;
  value_type *in_stack_ffffffffffffff60;
  size_type in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  uint uVar6;
  undefined4 in_stack_ffffffffffffff74;
  uint local_70;
  uint local_44;
  uint local_38;
  uint local_34;
  bool local_1;
  
  if ((simplifyCandidate(Kernel::Clause*,Kernel::Clause*,std::vector<Inferences::BwSimplificationRecord,std::allocator<Inferences::BwSimplificationRecord>>&)
       ::alts == '\0') &&
     (iVar2 = __cxa_guard_acquire(&simplifyCandidate(Kernel::Clause*,Kernel::Clause*,std::vector<Inferences::BwSimplificationRecord,std::allocator<Inferences::BwSimplificationRecord>>&)
                                   ::alts), iVar2 != 0)) {
    std::vector<Lib::List<Kernel::Literal_*>_*,_std::allocator<Lib::List<Kernel::Literal_*>_*>_>::
    vector((vector<Lib::List<Kernel::Literal_*>_*,_std::allocator<Lib::List<Kernel::Literal_*>_*>_>
            *)0x76f6da);
    __cxa_atexit(std::
                 vector<Lib::List<Kernel::Literal_*>_*,_std::allocator<Lib::List<Kernel::Literal_*>_*>_>
                 ::~vector,&simplifyCandidate::alts,&__dso_handle);
    __cxa_guard_release(&simplifyCandidate(Kernel::Clause*,Kernel::Clause*,std::vector<Inferences::BwSimplificationRecord,std::allocator<Inferences::BwSimplificationRecord>>&)
                         ::alts);
  }
  std::vector<Lib::List<Kernel::Literal_*>_*,_std::allocator<Lib::List<Kernel::Literal_*>_*>_>::
  clear((vector<Lib::List<Kernel::Literal_*>_*,_std::allocator<Lib::List<Kernel::Literal_*>_*>_> *)
        0x76f70c);
  Kernel::Clause::length(in_RSI);
  Lib::List<Kernel::Literal_*>::empty();
  std::vector<Lib::List<Kernel::Literal_*>_*,_std::allocator<Lib::List<Kernel::Literal_*>_*>_>::
  resize((vector<Lib::List<Kernel::Literal_*>_*,_std::allocator<Lib::List<Kernel::Literal_*>_*>_> *)
         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68,
         in_stack_ffffffffffffff60);
  local_34 = 0;
  local_38 = 0;
  while (uVar6 = local_38, uVar3 = Kernel::Clause::length(in_RSI), uVar4 = local_34, uVar6 < uVar3)
  {
    Kernel::Clause::operator[](in_RSI,local_38);
    local_44 = 0;
    while (uVar6 = local_44, uVar3 = Kernel::Clause::length(in_RDX), uVar6 < uVar3) {
      Kernel::Clause::operator[](in_RDX,local_44);
      bVar1 = Kernel::MatchingUtils::match
                        ((Literal *)in_stack_ffffffffffffff50,
                         (Literal *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                         SUB81((ulong)in_stack_ffffffffffffff40 >> 0x38,0));
      if (bVar1) {
        std::vector<Lib::List<Kernel::Literal_*>_*,_std::allocator<Lib::List<Kernel::Literal_*>_*>_>
        ::operator[](&simplifyCandidate::alts,(ulong)local_38);
        Lib::List<Kernel::Literal_*>::push
                  ((Literal *)in_stack_ffffffffffffff40,
                   (List<Kernel::Literal_*> **)
                   CONCAT44(in_stack_ffffffffffffff3c,
                            CONCAT13(in_stack_ffffffffffffff3b,
                                     CONCAT12(in_stack_ffffffffffffff3a,in_stack_ffffffffffffff38)))
                  );
      }
      local_44 = local_44 + 1;
    }
    ppLVar5 = std::
              vector<Lib::List<Kernel::Literal_*>_*,_std::allocator<Lib::List<Kernel::Literal_*>_*>_>
              ::operator[](&simplifyCandidate::alts,(ulong)local_38);
    bVar1 = Lib::List<Kernel::Literal_*>::isEmpty(*ppLVar5);
    if (bVar1) {
      uVar4 = local_34 + 1;
      if (uVar4 != 1) break;
      bVar1 = Kernel::Literal::isEquality((Literal *)0x76f893);
      if ((!bVar1) || (bVar1 = Kernel::Literal::isPositive((Literal *)0x76f8a6), !bVar1)) {
        uVar4 = local_34 + 2;
        break;
      }
    }
    local_34 = uVar4;
    local_38 = local_38 + 1;
  }
  local_34 = uVar4;
  Lib::
  ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/BackwardSubsumptionDemodulation.cpp:309:5)>
  ::ScopeGuard((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_BackwardSubsumptionDemodulation_cpp:309:5)>
                *)in_stack_ffffffffffffff40,
               (anon_class_1_0_00000001_for_f *)
               CONCAT44(in_stack_ffffffffffffff3c,
                        CONCAT13(in_stack_ffffffffffffff3b,
                                 CONCAT12(in_stack_ffffffffffffff3a,in_stack_ffffffffffffff38))));
  if (local_34 < 2) {
    if ((simplifyCandidate(Kernel::Clause*,Kernel::Clause*,std::vector<Inferences::BwSimplificationRecord,std::allocator<Inferences::BwSimplificationRecord>>&)
         ::matcher == '\0') &&
       (iVar2 = __cxa_guard_acquire(&simplifyCandidate(Kernel::Clause*,Kernel::Clause*,std::vector<Inferences::BwSimplificationRecord,std::allocator<Inferences::BwSimplificationRecord>>&)
                                     ::matcher), iVar2 != 0)) {
      Kernel::MLMatcherSD::MLMatcherSD((MLMatcherSD *)0x76f92f);
      __cxa_atexit(Kernel::MLMatcherSD::~MLMatcherSD,&simplifyCandidate::matcher,&__dso_handle);
      __cxa_guard_release(&simplifyCandidate(Kernel::Clause*,Kernel::Clause*,std::vector<Inferences::BwSimplificationRecord,std::allocator<Inferences::BwSimplificationRecord>>&)
                           ::matcher);
    }
    std::vector<Lib::List<Kernel::Literal_*>_*,_std::allocator<Lib::List<Kernel::Literal_*>_*>_>::
    data((vector<Lib::List<Kernel::Literal_*>_*,_std::allocator<Lib::List<Kernel::Literal_*>_*>_> *)
         0x76f97d);
    Kernel::MLMatcherSD::init(&simplifyCandidate::matcher,(EVP_PKEY_CTX *)in_RSI);
    if ((simplifyCandidate(Kernel::Clause*,Kernel::Clause*,std::vector<Inferences::BwSimplificationRecord,std::allocator<Inferences::BwSimplificationRecord>>&)
         ::maxMatches == '\0') &&
       (iVar2 = __cxa_guard_acquire(&simplifyCandidate(Kernel::Clause*,Kernel::Clause*,std::vector<Inferences::BwSimplificationRecord,std::allocator<Inferences::BwSimplificationRecord>>&)
                                     ::maxMatches), iVar2 != 0)) {
      in_stack_ffffffffffffff50 = (Options *)(**(code **)(*in_RDI + 0x20))();
      in_stack_ffffffffffffff4c =
           Shell::Options::backwardSubsumptionDemodulationMaxMatches(in_stack_ffffffffffffff50);
      if (in_stack_ffffffffffffff4c == 0) {
        simplifyCandidate::maxMatches = std::numeric_limits<unsigned_int>::max();
      }
      else {
        in_stack_ffffffffffffff40 = (Options *)(**(code **)(*in_RDI + 0x20))();
        simplifyCandidate::maxMatches =
             Shell::Options::backwardSubsumptionDemodulationMaxMatches(in_stack_ffffffffffffff40);
      }
      in_stack_ffffffffffffff48 = simplifyCandidate::maxMatches;
      __cxa_guard_release(&simplifyCandidate(Kernel::Clause*,Kernel::Clause*,std::vector<Inferences::BwSimplificationRecord,std::allocator<Inferences::BwSimplificationRecord>>&)
                           ::maxMatches);
    }
    local_70 = 0;
    while ((local_70 < simplifyCandidate::maxMatches &&
           (bVar1 = Kernel::MLMatcherSD::nextMatch((MLMatcherSD *)0x76fa58), bVar1))) {
      bVar1 = rewriteCandidate(in_stack_000002a8,in_stack_000002a0,in_stack_00000298,
                               in_stack_00000290,in_stack_00000288);
      if (bVar1) {
        std::
        vector<Inferences::BwSimplificationRecord,std::allocator<Inferences::BwSimplificationRecord>>
        ::emplace_back<Kernel::Clause*&,Kernel::Clause*&>
                  ((vector<Inferences::BwSimplificationRecord,_std::allocator<Inferences::BwSimplificationRecord>_>
                    *)in_stack_ffffffffffffff50,
                   (Clause **)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   (Clause **)in_stack_ffffffffffffff40);
        local_1 = true;
        goto LAB_0076fb56;
      }
      local_70 = local_70 + 1;
    }
    local_1 = false;
  }
  else {
    local_1 = false;
  }
LAB_0076fb56:
  Lib::
  ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/BackwardSubsumptionDemodulation.cpp:309:5)>
  ::~ScopeGuard((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_BackwardSubsumptionDemodulation_cpp:309:5)>
                 *)in_stack_ffffffffffffff40);
  return local_1;
}

Assistant:

bool BackwardSubsumptionDemodulation::simplifyCandidate(Clause* sideCl, Clause* mainCl, std::vector<BwSimplificationRecord>& simplifications)
{
    static std::vector<LiteralList*> alts;

    alts.clear();
    alts.resize(sideCl->length(), LiteralList::empty());

    unsigned baseLitsWithoutAlternatives = 0;
    for (unsigned bi = 0; bi < sideCl->length(); ++bi) {
      Literal* baseLit = (*sideCl)[bi];

      for (unsigned ii = 0; ii < mainCl->length(); ++ii) {
        Literal* instLit = (*mainCl)[ii];
        if (MatchingUtils::match(baseLit, instLit, false)) {
          LiteralList::push(instLit, alts[bi]);
        }
      }  // for(ii)

      if (LiteralList::isEmpty(alts[bi])) {
        // baseLit does not have any suitable alternative at all!
        //
        // If there are base literals without any suitable alternatives:
        // 1. If there is only one literal without alternative and it is a positive equality,
        //    then it might still be possible to get an SD inference by choosing this literal
        //    as equality for demodulation.
        // 2. If there is a literal without alternative but it is not a positive equality,
        //    then it is impossible to get an SD inference.
        // 3. If there are two literals without alternatives, then it is impossible as well.
        //
        // (This check exists purely for performance reasons.
        // MLMatcher would exclude cases 2 and 3 as well, but with additional overhead.)
        baseLitsWithoutAlternatives += 1;
        if (baseLitsWithoutAlternatives == 1) {
          if (!baseLit->isEquality() || !baseLit->isPositive()) {
            // We are in case 2 => skip
            baseLitsWithoutAlternatives += 1;  // a hack so we don't need another variable to check whether to skip below (in other words, merge case 2 into case 3 for purpose of the "if" below)
            break;
          }
        } else {
          // We are in case 3 => skip
          ASS_G(baseLitsWithoutAlternatives, 1);
          break;
        }
      }
    }  // for(bi)

    // Ensure cleanup of LiteralLists
    ON_SCOPE_EXIT({
      for (LiteralList* ll : alts) {
        LiteralList::destroy(ll);
      }
    });

    // Skip due to missing alternatives? (see comment above, "baseLit does not have any suitable alternative")
    if (baseLitsWithoutAlternatives > 1) {
      RSTAT_CTR_INC("BSD, skipped candidate main premise due to baseLitsWithoutAlternatives");
      return false;
    }

    ASS_LE(baseLitsWithoutAlternatives, 1);
    ASS_EQ(sideCl->length(), alts.size());

    static MLMatcherSD matcher;
    matcher.init(sideCl, mainCl, alts.data());

    static unsigned const maxMatches =
      getOptions().backwardSubsumptionDemodulationMaxMatches() == 0
      ? std::numeric_limits<decltype(maxMatches)>::max()
      : getOptions().backwardSubsumptionDemodulationMaxMatches();

    unsigned numMatches = 0;
    for (; numMatches < maxMatches; ++numMatches) {
      if (!matcher.nextMatch()) {
        break;
      }

      Clause* replacement = nullptr;
      if (rewriteCandidate(sideCl, mainCl, matcher, replacement)) {
        RSTAT_MCTR_INC("BSD, successes by MLMatch", numMatches + 1);  // +1 so it fits with the previous output
        simplifications.emplace_back(mainCl, replacement);
        return true;
      }
    }  // for (numMatches)

    if (numMatches > 0) {
      RSTAT_CTR_INC("BSD, MLMatch but no subsumption demodulation");
    }

    return false;
}